

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::create_connected_constraints
          (Proof *this,int p,int t,function<bool_(int,_int)> *adj)

{
  long *plVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  Proof *pPVar3;
  pointer pbVar4;
  bool bVar5;
  _Tuple_impl<2UL,_int> _Var6;
  uint uVar7;
  _Tuple_impl<2UL,_int> _Var8;
  uint uVar9;
  _Tuple_impl<1UL,_int,_int> _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ostream *poVar12;
  mapped_type *pmVar13;
  _Tuple_impl<1UL,_int,_int> _Var14;
  mapped_type *pmVar15;
  iterator iVar16;
  _Tuple_impl<1UL,_int,_int> _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  _Head_base<2UL,_int,_false> _Var21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  long lVar22;
  _Tuple_impl<2UL,_int,_int> _Var23;
  pointer pbVar24;
  _Tuple_impl<1UL,_int,_int> _Var25;
  _Head_base<2UL,_int,_false> __val;
  undefined8 uVar26;
  ulong uVar27;
  uint uVar28;
  _Tuple_impl<1UL,_int,_int> _Var29;
  _Tuple_impl<1UL,_int,_int> _Var30;
  uint uVar31;
  _Tuple_impl<1UL,_int,_int> _Var32;
  _Tuple_impl<1UL,_int,_int> _Var33;
  _Tuple_impl<1UL,_int,_int> _Var34;
  string m;
  string n;
  string __str;
  string __str_1;
  uint __uval;
  string __str_3;
  string __str_2;
  string __str_7;
  string __str_6;
  string __str_5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ors;
  string __str_4;
  _Tuple_impl<1UL,_int,_int> local_218;
  undefined1 local_210 [8];
  _Tuple_impl<1UL,_int,_int> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Tuple_impl<1UL,_int,_int> local_1f0;
  Proof *local_1e8;
  undefined1 local_1e0 [8];
  _Tuple_impl<1UL,_int,_int> local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  uint local_160;
  uint local_15c;
  _Tuple_impl<1UL,_int,_int> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  uint local_130;
  uint local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Tuple_impl<1UL,_int,_int> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  uint local_7c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _Var10.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  _Var10.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)p;
  local_1f0 = (_Tuple_impl<1UL,_int,_int>)adj;
  local_130 = t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50,
             "* selected vertices must be connected, walk 1\n",0x2e);
  local_1e8 = this;
  local_160 = p;
  local_e8 = _Var10;
  if (0 < p) {
    _Var10 = (_Tuple_impl<1UL,_int,_int>)(long)(int)local_130;
    _Var34.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (_Head_base<2UL,_int,_false>)0x0;
    _Var34.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
    do {
      if (_Var34 != (_Tuple_impl<1UL,_int,_int>)0x0) {
        _Var29.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (_Head_base<2UL,_int,_false>)0x0;
        _Var29.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
        do {
          uVar31 = 1;
          _Var8 = _Var34.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
          if (9 < (ulong)_Var34) {
            uVar28 = 4;
            _Var17 = _Var34;
            do {
              uVar31 = uVar28;
              _Var6 = _Var17.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                      _M_head_impl;
              if ((uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_001537d3;
              }
              if ((uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_001537d3;
              }
              if ((uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
              goto LAB_001537d3;
              _Var17 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var17 & 0xffffffff) / 10000);
              uVar28 = uVar31 + 4;
            } while (99999 < (uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl);
            uVar31 = uVar31 + 1;
          }
LAB_001537d3:
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_1a0,(ulong)uVar31,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_1a0._M_dataplus._M_p,uVar31,
                     (uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl);
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_1a0,0,0,"conn1_",6);
          local_1e0 = (undefined1  [8])&local_1d0;
          _Var23 = (_Tuple_impl<2UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
          paVar18 = &pbVar11->field_2;
          if (_Var23 == (_Tuple_impl<2UL,_int,_int>)paVar18) {
            local_1d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_1d0._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          }
          else {
            local_1d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_1e0 = (undefined1  [8])_Var23;
          }
          local_1d8 = (_Tuple_impl<1UL,_int,_int>)pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e0,"_");
          local_210 = (undefined1  [8])&local_200;
          _Var17 = (_Tuple_impl<1UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
          paVar18 = &pbVar11->field_2;
          if (_Var17 == (_Tuple_impl<1UL,_int,_int>)paVar18) {
            local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_200._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          }
          else {
            local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_210 = (undefined1  [8])_Var17;
          }
          local_208 = (_Tuple_impl<1UL,_int,_int>)pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          uVar31 = 1;
          _Var21._M_head_impl =
               (int)_Var29.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                    _M_head_impl;
          if (9 < (ulong)_Var29) {
            uVar28 = 4;
            _Var17 = _Var29;
            do {
              uVar31 = uVar28;
              _Var6 = _Var17.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                      _M_head_impl;
              if ((uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0015390d;
              }
              if ((uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0015390d;
              }
              if ((uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
              goto LAB_0015390d;
              _Var17 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var17 & 0xffffffff) / 10000);
              uVar28 = uVar31 + 4;
            } while (99999 < (uint)_Var6.super__Head_base<2UL,_int,_false>._M_head_impl);
            uVar31 = uVar31 + 1;
          }
LAB_0015390d:
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_180,(ulong)uVar31,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_180._M_dataplus._M_p,uVar31,_Var21._M_head_impl);
          pPVar3 = local_1e8;
          uVar26 = 0xf;
          if (local_210 != (undefined1  [8])&local_200) {
            uVar26 = local_200._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_180._M_string_length + (long)local_208) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              uVar26 = local_180.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_180._M_string_length + (long)local_208) goto LAB_0015399d;
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_180,0,0,(char *)local_210,(size_type)local_208);
          }
          else {
LAB_0015399d:
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_210,local_180._M_dataplus._M_p,local_180._M_string_length)
            ;
          }
          local_1c0._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar18 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p == paVar18) {
            local_1c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          }
          else {
            local_1c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          }
          local_1c0._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar11->_M_string_length = 0;
          paVar18->_M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if (local_210 != (undefined1  [8])&local_200) {
            operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
          }
          if (local_1e0 != (undefined1  [8])&local_1d0) {
            operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          local_208.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
               (_Head_base<2UL,_int,_false>)0x1;
          local_210._0_4_ = _Var21._M_head_impl;
          local_210._4_4_ = _Var8.super__Head_base<2UL,_int,_false>._M_head_impl;
          std::
          _Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::tuple<int,int,int>,std::__cxx11::string&>
                    ((_Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                      *)&((pPVar3->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         connected_variable_mappings,(tuple<int,_int,_int> *)local_210,&local_1c0);
          local_210._0_4_ = _Var8.super__Head_base<2UL,_int,_false>._M_head_impl;
          local_1e0._0_4_ = _Var21._M_head_impl;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_1f0 + 0x10))->_M_allocated_capacity == 0) {
            std::__throw_bad_function_call();
          }
          bVar5 = (**(code **)((long)local_1f0 + 0x18))
                            ((_Any_data *)local_1f0,(int *)local_210,(int *)local_1e0);
          poVar12 = (ostream *)
                    &((local_1e8->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     field_0x50;
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 ~x",4);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
            local_210 = (undefined1  [8])_Var34;
            local_208 = _Var10;
            pmVar13 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_210);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pmVar13->_M_dataplus)._M_p,pmVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
            poVar12 = (ostream *)
                      &((local_1e8->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 ~x",4);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
            local_210 = (undefined1  [8])_Var29;
            local_208 = _Var10;
            pmVar13 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_210);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pmVar13->_M_dataplus)._M_p,pmVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
            poVar12 = (ostream *)
                      &((local_1e8->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 x",4);
            local_210 = (undefined1  [8])_Var34;
            local_208 = _Var10;
            pmVar13 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_210);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pmVar13->_M_dataplus)._M_p,pmVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 x",4);
            local_1e0 = (undefined1  [8])_Var29;
            local_1d8 = _Var10;
            pmVar13 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_1e0);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pmVar13->_M_dataplus)._M_p,pmVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
            lVar22 = 3;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 ~x",4);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            lVar22 = 1;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
          }
          this = local_1e8;
          plVar1 = &((local_1e8->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    nb_constraints;
          *plVar1 = *plVar1 + lVar22;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          _Var29 = (_Tuple_impl<1UL,_int,_int>)((long)_Var29 + 1);
        } while (_Var29 != _Var34);
      }
      _Var34 = (_Tuple_impl<1UL,_int,_int>)((long)_Var34 + 1);
    } while (_Var34 != local_e8);
  }
  local_7c = local_160;
  if ((int)local_130 < (int)local_160) {
    local_7c = local_130;
  }
  uVar31 = 2;
  do {
    poVar12 = (ostream *)
              &((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"* selected vertices must be connected, walk ",0x2c);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,uVar31);
    local_1c0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1c0,1);
    if (0 < (int)local_160) {
      local_15c = -uVar31;
      if (0 < (int)uVar31) {
        local_15c = uVar31;
      }
      uVar27 = (ulong)local_15c;
      uVar20 = (ulong)(uVar31 >> 0x1f);
      local_158 = (_Tuple_impl<1UL,_int,_int>)(long)((int)uVar31 >> 1);
      _Var17.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)0x0;
      _Var17.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
      local_12c = uVar31;
      local_58 = uVar20;
      do {
        local_1f0 = _Var17;
        if (_Var17 != (_Tuple_impl<1UL,_int,_int>)0x0) {
          local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
               (_Head_base<2UL,_int,_false>)0x0;
          local_218.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
          do {
            uVar28 = 1;
            uVar31 = (uint)uVar27;
            if (9 < uVar31) {
              uVar9 = 4;
              do {
                uVar28 = uVar9;
                uVar7 = (uint)uVar27;
                if (uVar7 < 100) {
                  uVar28 = uVar28 - 2;
                  goto LAB_00153e80;
                }
                if (uVar7 < 1000) {
                  uVar28 = uVar28 - 1;
                  goto LAB_00153e80;
                }
                if (uVar7 < 10000) goto LAB_00153e80;
                uVar27 = uVar27 / 10000;
                uVar9 = uVar28 + 4;
              } while (99999 < uVar7);
              uVar28 = uVar28 + 1;
            }
LAB_00153e80:
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_108,(ulong)((int)uVar20 + uVar28),'-');
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_108._M_dataplus._M_p + uVar20,uVar28,uVar31);
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_108,0,0,"conn",4);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar11->_M_dataplus)._M_p;
            paVar19 = &pbVar11->field_2;
            if (paVar18 == paVar19) {
              local_180.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
              local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            }
            else {
              local_180.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
              local_180._M_dataplus._M_p = (pointer)paVar18;
            }
            local_180._M_string_length = pbVar11->_M_string_length;
            (pbVar11->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar11->_M_string_length = 0;
            (pbVar11->field_2)._M_local_buf[0] = '\0';
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_180,"_");
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            _Var23 = (_Tuple_impl<2UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
            paVar18 = &pbVar11->field_2;
            if (_Var23 == (_Tuple_impl<2UL,_int,_int>)paVar18) {
              local_1a0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            }
            else {
              local_1a0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_1a0._M_dataplus._M_p = (pointer)_Var23;
            }
            local_1a0._M_string_length = pbVar11->_M_string_length;
            (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar11->_M_string_length = 0;
            (pbVar11->field_2)._M_local_buf[0] = '\0';
            uVar31 = 1;
            if (9 < (ulong)local_1f0) {
              uVar28 = 4;
              _Var10 = local_1f0;
              do {
                uVar31 = uVar28;
                _Var8 = _Var10.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                        _M_head_impl;
                if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_00153fe4;
                }
                if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_00153fe4;
                }
                if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                goto LAB_00153fe4;
                _Var10 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var10 & 0xffffffff) / 10000);
                uVar28 = uVar31 + 4;
              } while (99999 < (uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl);
              uVar31 = uVar31 + 1;
            }
LAB_00153fe4:
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_150,(ulong)uVar31,'-');
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_150._M_dataplus._M_p,uVar31,
                       (uint)local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>
                             ._M_head_impl.super__Head_base<2UL,_int,_false>);
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              uVar26 = local_1a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_150._M_string_length + local_1a0._M_string_length) {
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                uVar26 = local_150.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_150._M_string_length + local_1a0._M_string_length)
              goto LAB_00154078;
              pbVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  (&local_150,0,0,local_1a0._M_dataplus._M_p,
                                   local_1a0._M_string_length);
            }
            else {
LAB_00154078:
              pbVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_1a0,local_150._M_dataplus._M_p,local_150._M_string_length)
              ;
            }
            local_1e0 = (undefined1  [8])&local_1d0;
            _Var10 = (_Tuple_impl<1UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
            paVar18 = &pbVar11->field_2;
            if (_Var10 == (_Tuple_impl<1UL,_int,_int>)paVar18) {
              local_1d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_1d0._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            }
            else {
              local_1d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_1e0 = (undefined1  [8])_Var10;
            }
            local_1d8 = (_Tuple_impl<1UL,_int,_int>)pbVar11->_M_string_length;
            (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar11->_M_string_length = 0;
            paVar18->_M_local_buf[0] = '\0';
            pbVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e0,"_");
            local_210 = (undefined1  [8])&local_200;
            _Var10 = (_Tuple_impl<1UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
            paVar18 = &pbVar11->field_2;
            if (_Var10 == (_Tuple_impl<1UL,_int,_int>)paVar18) {
              local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_200._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            }
            else {
              local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_210 = (undefined1  [8])_Var10;
            }
            local_208 = (_Tuple_impl<1UL,_int,_int>)pbVar11->_M_string_length;
            (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar11->_M_string_length = 0;
            (pbVar11->field_2)._M_local_buf[0] = '\0';
            uVar31 = 1;
            if (9 < (ulong)local_218) {
              _Var10 = local_218;
              uVar28 = 4;
              do {
                uVar31 = uVar28;
                _Var8 = _Var10.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                        _M_head_impl;
                if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_0015418b;
                }
                if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_0015418b;
                }
                if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                goto LAB_0015418b;
                _Var10 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var10 & 0xffffffff) / 10000);
                uVar28 = uVar31 + 4;
              } while (99999 < (uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl);
              uVar31 = uVar31 + 1;
            }
LAB_0015418b:
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_128,(ulong)uVar31,'-');
            _Var21._M_head_impl =
                 (int)local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                      _M_head_impl;
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_128._M_dataplus._M_p,uVar31,_Var21._M_head_impl);
            uVar31 = local_12c;
            uVar26 = 0xf;
            if (local_210 != (undefined1  [8])&local_200) {
              uVar26 = local_200._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_128._M_string_length + (long)local_208) {
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                uVar26 = local_128.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_128._M_string_length + (long)local_208) goto LAB_0015421c;
              pbVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  (&local_128,0,0,(char *)local_210,(size_type)local_208);
            }
            else {
LAB_0015421c:
              pbVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_210,local_128._M_dataplus._M_p,
                                   local_128._M_string_length);
            }
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            _Var10 = (_Tuple_impl<1UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
            paVar18 = &pbVar11->field_2;
            if (_Var10 == (_Tuple_impl<1UL,_int,_int>)paVar18) {
              local_1c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            }
            else {
              local_1c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_1c0._M_dataplus._M_p = (pointer)_Var10;
            }
            local_1c0._M_string_length = pbVar11->_M_string_length;
            (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar11->_M_string_length = 0;
            paVar18->_M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_210 != (undefined1  [8])&local_200) {
              operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
            }
            if (local_1e0 != (undefined1  [8])&local_1d0) {
              operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            local_210._4_4_ =
                 (_Head_base<2UL,_int,_false>)
                 local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_210._0_4_ = _Var21._M_head_impl;
            local_208.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                 (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)uVar31;
            std::
            _Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::tuple<int,int,int>,std::__cxx11::string&>
                      ((_Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                        *)&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->connected_variable_mappings,(tuple<int,_int,_int> *)local_210,
                       &local_1c0);
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __val._M_head_impl = 0;
            _Var10 = local_1f0;
            uVar31 = local_15c;
            do {
              uVar20 = local_58;
              _Var14.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
              _Var14.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                   (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)__val._M_head_impl;
              if (local_218 != _Var14 && _Var10 != _Var14) {
                uVar28 = 1;
                if (9 < uVar31) {
                  uVar27 = (ulong)uVar31;
                  uVar31 = 4;
                  do {
                    uVar28 = uVar31;
                    uVar9 = (uint)uVar27;
                    if (uVar9 < 100) {
                      uVar28 = uVar28 - 2;
                      goto LAB_00154438;
                    }
                    if (uVar9 < 1000) {
                      uVar28 = uVar28 - 1;
                      goto LAB_00154438;
                    }
                    if (uVar9 < 10000) goto LAB_00154438;
                    uVar27 = uVar27 / 10000;
                    uVar31 = uVar28 + 4;
                  } while (99999 < uVar9);
                  uVar28 = uVar28 + 1;
                }
LAB_00154438:
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_50,(ulong)((int)local_58 + uVar28),'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_50._M_dataplus._M_p + uVar20,uVar28,local_15c);
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&local_50,0,0,"conn",4);
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar11->_M_dataplus)._M_p;
                paVar19 = &pbVar11->field_2;
                if (paVar18 == paVar19) {
                  local_128.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_128.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_128._M_dataplus._M_p = (pointer)paVar18;
                }
                local_128._M_string_length = pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar19;
                pbVar11->_M_string_length = 0;
                (pbVar11->field_2)._M_local_buf[0] = '\0';
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_128,"_");
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar11->_M_dataplus)._M_p;
                paVar19 = &pbVar11->field_2;
                if (paVar18 == paVar19) {
                  local_150.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_150.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_150._M_dataplus._M_p = (pointer)paVar18;
                }
                local_150._M_string_length = pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar19;
                pbVar11->_M_string_length = 0;
                (pbVar11->field_2)._M_local_buf[0] = '\0';
                uVar31 = 1;
                if (9 < (ulong)local_1f0) {
                  uVar28 = 4;
                  _Var10 = local_1f0;
                  do {
                    uVar31 = uVar28;
                    _Var8 = _Var10.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                            _M_head_impl;
                    if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                      uVar31 = uVar31 - 2;
                      goto LAB_001545b1;
                    }
                    if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                      uVar31 = uVar31 - 1;
                      goto LAB_001545b1;
                    }
                    if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                    goto LAB_001545b1;
                    _Var10 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var10 & 0xffffffff) / 10000);
                    uVar28 = uVar31 + 4;
                  } while (99999 < (uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl);
                  uVar31 = uVar31 + 1;
                }
LAB_001545b1:
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_a0,(ulong)uVar31,'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_a0._M_dataplus._M_p,uVar31,
                           (uint)local_1f0.super__Tuple_impl<2UL,_int>.
                                 super__Head_base<2UL,_int,_false>._M_head_impl.
                                 super__Head_base<2UL,_int,_false>);
                uVar26 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  uVar26 = local_150.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_a0._M_string_length + local_150._M_string_length) {
                  uVar26 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    uVar26 = local_a0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar26 < local_a0._M_string_length + local_150._M_string_length)
                  goto LAB_0015464a;
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_a0,0,0,local_150._M_dataplus._M_p,
                                    local_150._M_string_length);
                }
                else {
LAB_0015464a:
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&local_150,local_a0._M_dataplus._M_p,local_a0._M_string_length
                                     );
                }
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar11->_M_dataplus)._M_p;
                paVar18 = &pbVar11->field_2;
                if (paVar19 == paVar18) {
                  local_108.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_108.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_108._M_dataplus._M_p = (pointer)paVar19;
                }
                local_108._M_string_length = pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar11->_M_string_length = 0;
                paVar18->_M_local_buf[0] = '\0';
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_108,"_");
                local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar11->_M_dataplus)._M_p;
                paVar19 = &pbVar11->field_2;
                if (paVar18 == paVar19) {
                  local_180.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_180.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_180._M_dataplus._M_p = (pointer)paVar18;
                }
                local_180._M_string_length = pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar19;
                pbVar11->_M_string_length = 0;
                (pbVar11->field_2)._M_local_buf[0] = '\0';
                uVar31 = 1;
                if (9 < (ulong)local_218) {
                  _Var10 = local_218;
                  uVar28 = 4;
                  do {
                    uVar31 = uVar28;
                    _Var8 = _Var10.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                            _M_head_impl;
                    if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                      uVar31 = uVar31 - 2;
                      goto LAB_00154787;
                    }
                    if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                      uVar31 = uVar31 - 1;
                      goto LAB_00154787;
                    }
                    if ((uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                    goto LAB_00154787;
                    _Var10 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var10 & 0xffffffff) / 10000);
                    uVar28 = uVar31 + 4;
                  } while (99999 < (uint)_Var8.super__Head_base<2UL,_int,_false>._M_head_impl);
                  uVar31 = uVar31 + 1;
                }
LAB_00154787:
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_c0,(ulong)uVar31,'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_c0._M_dataplus._M_p,uVar31,_Var21._M_head_impl);
                uVar26 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  uVar26 = local_180.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_c0._M_string_length + local_180._M_string_length) {
                  uVar26 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                    uVar26 = local_c0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar26 < local_c0._M_string_length + local_180._M_string_length)
                  goto LAB_0015481f;
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_c0,0,0,local_180._M_dataplus._M_p,
                                    local_180._M_string_length);
                }
                else {
LAB_0015481f:
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&local_180,local_c0._M_dataplus._M_p,local_c0._M_string_length
                                     );
                }
                local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar11->_M_dataplus)._M_p;
                paVar18 = &pbVar11->field_2;
                if (paVar19 == paVar18) {
                  local_1a0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_1a0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_1a0._M_dataplus._M_p = (pointer)paVar19;
                }
                local_1a0._M_string_length = pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar11->_M_string_length = 0;
                paVar18->_M_local_buf[0] = '\0';
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_1a0,"_via_");
                local_1e0 = (undefined1  [8])&local_1d0;
                _Var23 = (_Tuple_impl<2UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
                paVar18 = &pbVar11->field_2;
                if (_Var23 == (_Tuple_impl<2UL,_int,_int>)paVar18) {
                  local_1d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_1d0._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_1d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_1e0 = (undefined1  [8])_Var23;
                }
                local_1d8 = (_Tuple_impl<1UL,_int,_int>)pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar11->_M_string_length = 0;
                (pbVar11->field_2)._M_local_buf[0] = '\0';
                uVar31 = 1;
                if (9 < (uint)__val._M_head_impl) {
                  uVar20 = (ulong)(uint)__val._M_head_impl;
                  uVar28 = 4;
                  do {
                    uVar31 = uVar28;
                    uVar9 = (uint)uVar20;
                    if (uVar9 < 100) {
                      uVar31 = uVar31 - 2;
                      goto LAB_00154944;
                    }
                    if (uVar9 < 1000) {
                      uVar31 = uVar31 - 1;
                      goto LAB_00154944;
                    }
                    if (uVar9 < 10000) goto LAB_00154944;
                    uVar20 = uVar20 / 10000;
                    uVar28 = uVar31 + 4;
                  } while (99999 < uVar9);
                  uVar31 = uVar31 + 1;
                }
LAB_00154944:
                local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_e0,(ulong)uVar31,'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_e0._M_dataplus._M_p,uVar31,__val._M_head_impl);
                uVar26 = 0xf;
                if (local_1e0 != (undefined1  [8])&local_1d0) {
                  uVar26 = local_1d0._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_e0._M_string_length + (long)local_1d8) {
                  uVar26 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                    uVar26 = local_e0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar26 < local_e0._M_string_length + (long)local_1d8)
                  goto LAB_001549ce;
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_e0,0,0,(char *)local_1e0,(size_type)local_1d8);
                }
                else {
LAB_001549ce:
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1e0,local_e0._M_dataplus._M_p,
                                      local_e0._M_string_length);
                }
                local_210 = (undefined1  [8])&local_200;
                _Var10 = (_Tuple_impl<1UL,_int,_int>)(pbVar11->_M_dataplus)._M_p;
                paVar18 = &pbVar11->field_2;
                if (_Var10 == (_Tuple_impl<1UL,_int,_int>)paVar18) {
                  local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_200._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                }
                else {
                  local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_210 = (undefined1  [8])_Var10;
                }
                local_208 = (_Tuple_impl<1UL,_int,_int>)pbVar11->_M_string_length;
                (pbVar11->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar11->_M_string_length = 0;
                paVar18->_M_local_buf[0] = '\0';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                if (local_1e0 != (undefined1  [8])&local_1d0) {
                  operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                  operator_delete(local_1a0._M_dataplus._M_p,
                                  local_1a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  operator_delete(local_180._M_dataplus._M_p,
                                  local_180.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p != &local_128.field_2) {
                  operator_delete(local_128._M_dataplus._M_p,
                                  local_128.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_78,(value_type *)local_210);
                pPVar3 = local_1e8;
                local_1e0._4_4_ = _Var21._M_head_impl;
                local_1e0._0_4_ = __val._M_head_impl;
                local_1d8 = (_Tuple_impl<1UL,_int,_int>)
                            CONCAT44(local_12c,
                                     local_1f0.super__Tuple_impl<2UL,_int>.
                                     super__Head_base<2UL,_int,_false>._M_head_impl.
                                     super__Head_base<2UL,_int,_false>);
                std::
                _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::tuple<int,int,int,int>,std::__cxx11::string&>
                          ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
                            *)&((local_1e8->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->connected_variable_mappings_aux,
                           (tuple<int,_int,_int,_int> *)local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_210);
                poVar12 = (ostream *)
                          &((pPVar3->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
                bVar5 = (uint)local_1f0.super__Tuple_impl<2UL,_int>.
                              super__Head_base<2UL,_int,_false>._M_head_impl.
                              super__Head_base<2UL,_int,_false> < (uint)__val._M_head_impl;
                _Var33.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
                _Var33.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                     (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)__val._M_head_impl;
                if (bVar5) {
                  _Var33 = (_Tuple_impl<1UL,_int,_int>)((ulong)local_1f0 & 0xffffffff);
                }
                _Var32 = (_Tuple_impl<1UL,_int,_int>)((ulong)local_1f0 & 0xffffffff);
                if (bVar5) {
                  _Var32.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
                  _Var32.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
                       = (_Head_base<2UL,_int,_false>)
                         (_Head_base<2UL,_int,_false>)__val._M_head_impl;
                }
                local_1d0._M_allocated_capacity._0_4_ =
                     local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1d0._M_allocated_capacity._4_4_ =
                     local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1e0 = (undefined1  [8])_Var33;
                local_1d8 = _Var32;
                pmVar15 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)local_1e0);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(char *)local_210,(long)local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
                poVar12 = (ostream *)
                          &((local_1e8->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
                _Var23.super__Head_base<2UL,_int,_false>._M_head_impl = 0;
                _Var23.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                     (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)__val._M_head_impl;
                if ((uint)_Var21._M_head_impl < (uint)__val._M_head_impl) {
                  _Var23 = (_Tuple_impl<2UL,_int,_int>)((ulong)local_218 & 0xffffffff);
                }
                uVar20 = (ulong)local_218 & 0xffffffff;
                if ((uint)_Var21._M_head_impl < (uint)__val._M_head_impl) {
                  uVar20 = (ulong)(uint)__val._M_head_impl;
                }
                local_1d0._M_allocated_capacity._0_4_ =
                     local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1d0._M_allocated_capacity._4_4_ =
                     local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1e0 = (undefined1  [8])_Var23;
                local_1d8 = (_Tuple_impl<1UL,_int,_int>)uVar20;
                pmVar15 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)local_1e0);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(char *)local_210,(long)local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
                poVar12 = (ostream *)
                          &((local_1e8->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(char *)local_210,(long)local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
                local_1d0._M_allocated_capacity._0_4_ =
                     local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1d0._M_allocated_capacity._4_4_ =
                     local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1e0 = (undefined1  [8])_Var33;
                local_1d8 = _Var32;
                pmVar15 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)local_1e0);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
                this = local_1e8;
                local_1a0.field_2._M_allocated_capacity._0_4_ =
                     local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1a0.field_2._M_allocated_capacity._4_4_ =
                     local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1a0._M_dataplus._M_p = (pointer)_Var23;
                local_1a0._M_string_length = uVar20;
                pmVar15 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)&local_1a0);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
                plVar1 = &((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          nb_constraints;
                *plVar1 = *plVar1 + 3;
                _Var10 = local_1f0;
                uVar31 = local_15c;
                if (local_210 != (undefined1  [8])&local_200) {
                  operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
                  _Var10 = local_1f0;
                  uVar31 = local_15c;
                }
              }
              __val._M_head_impl = __val._M_head_impl + 1;
            } while (__val._M_head_impl != local_160);
            poVar12 = (ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 ~x",4);
            uVar31 = local_12c;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            pbVar4 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar24 = local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar4;
                pbVar24 = pbVar24 + 1) {
              poVar12 = (ostream *)
                        &((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         field_0x50;
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 x",4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(pbVar24->_M_dataplus)._M_p,pbVar24->_M_string_length);
            }
            poVar12 = (ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 x",4);
            local_210._0_4_ =
                 local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_210._4_4_ = local_218.super__Head_base<1UL,_int,_false>._M_head_impl;
            local_208 = local_1f0;
            local_200._M_allocated_capacity._0_4_ =
                 local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_200._M_allocated_capacity._4_4_ =
                 local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
            pmVar15 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,(key_type *)local_210
                                  );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        field_0x50," >= 1 ;\n",8);
            pbVar4 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            plVar1 = &((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      nb_constraints;
            *plVar1 = *plVar1 + 1;
            for (pbVar24 = local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar4;
                pbVar24 = pbVar24 + 1) {
              poVar12 = (ostream *)
                        &((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         field_0x50;
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(pbVar24->_M_dataplus)._M_p,pbVar24->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
              plVar1 = &((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        nb_constraints;
              *plVar1 = *plVar1 + 1;
            }
            poVar12 = (ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 ~x",5);
            local_210._0_4_ =
                 local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_210._4_4_ = local_218.super__Head_base<1UL,_int,_false>._M_head_impl;
            local_208 = local_1f0;
            local_200._M_allocated_capacity._0_4_ =
                 local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_200._M_allocated_capacity._4_4_ =
                 local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
            pmVar15 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,(key_type *)local_210
                                  );
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= 1 ;\n",8);
            plVar1 = &((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      nb_constraints;
            *plVar1 = *plVar1 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            local_218 = (_Tuple_impl<1UL,_int,_int>)((long)local_218 + 1);
            uVar27 = (ulong)local_15c;
            uVar20 = local_58;
          } while (local_218 != local_1f0);
        }
        _Var17 = (_Tuple_impl<1UL,_int,_int>)((long)local_1f0 + 1);
      } while (_Var17 != local_e8);
    }
    if ((int)local_7c <= (int)uVar31) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x50,"* if two vertices are used, they must be connected\n",0x33);
      pPVar3 = local_1e8;
      if (0 < (int)local_160) {
        local_158 = (_Tuple_impl<1UL,_int,_int>)(long)(int)local_130;
        _Var25.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (_Head_base<2UL,_int,_false>)0x0;
        _Var25.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
        do {
          if (_Var25 != (_Tuple_impl<1UL,_int,_int>)0x0) {
            _Var30.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                 (_Head_base<2UL,_int,_false>)0x0;
            _Var30.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
            local_1f0 = _Var25;
            do {
              poVar12 = (ostream *)
                        &((pPVar3->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         field_0x50;
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"1 x",3);
              _Var10 = local_158;
              local_1c0._M_string_length._0_4_ =
                   local_158.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                   _M_head_impl;
              local_1c0._M_string_length._4_4_ =
                   local_158.super__Head_base<1UL,_int,_false>._M_head_impl;
              local_1c0._M_dataplus._M_p = (pointer)_Var25;
              pmVar13 = std::
                        map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&((pPVar3->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->variable_mappings,(key_type *)&local_1c0);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(pmVar13->_M_dataplus)._M_p,pmVar13->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 x",4);
              _Var25 = local_1f0;
              local_208 = _Var10;
              local_210 = (undefined1  [8])_Var30;
              pmVar13 = std::
                        map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&((pPVar3->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->variable_mappings,(key_type *)local_210);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(pmVar13->_M_dataplus)._M_p,pmVar13->_M_string_length);
              _Var10 = local_1f0;
              local_1f0.super__Tuple_impl<2UL,_int> =
                   _Var25.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
              ;
              local_1f0.super__Head_base<1UL,_int,_false> =
                   _Var25.super__Head_base<1UL,_int,_false>._M_head_impl;
              local_1c0._M_string_length._0_4_ =
                   local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                   _M_head_impl;
              local_1c0._M_string_length._4_4_ =
                   local_1f0.super__Head_base<1UL,_int,_false>._M_head_impl;
              local_1f0 = _Var10;
              local_1c0._M_dataplus._M_p = (pointer)_Var30;
              local_1c0.field_2._M_allocated_capacity = (long)(int)uVar31;
              iVar16 = std::
                       _Rb_tree<std::tuple<long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::find(&(((pPVar3->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->connected_variable_mappings)._M_t,
                              (key_type *)&local_1c0);
              _Var2._M_head_impl =
                   (pPVar3->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
              if (iVar16._M_node !=
                  (_Base_ptr)((long)&(_Var2._M_head_impl)->connected_variable_mappings + 8U)) {
                poVar12 = (ostream *)&(_Var2._M_head_impl)->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," 1 x",4);
                _Var10 = local_1f0;
                local_1f0.super__Tuple_impl<2UL,_int> =
                     _Var25.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1f0.super__Head_base<1UL,_int,_false> =
                     _Var25.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1c0._M_string_length._0_4_ =
                     local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1c0._M_string_length._4_4_ =
                     local_1f0.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1f0 = _Var10;
                local_1c0._M_dataplus._M_p = (pointer)_Var30;
                local_1c0.field_2._M_allocated_capacity = (long)(int)uVar31;
                pmVar15 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((pPVar3->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)&local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(pmVar15->_M_dataplus)._M_p,pmVar15->_M_string_length);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((pPVar3->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          field_0x50," >= 1 ;\n",8);
              plVar1 = &((pPVar3->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        nb_constraints;
              *plVar1 = *plVar1 + 1;
              _Var30 = (_Tuple_impl<1UL,_int,_int>)((long)_Var30 + 1);
            } while (_Var25 != _Var30);
          }
          _Var25 = (_Tuple_impl<1UL,_int,_int>)((long)_Var25 + 1);
        } while (_Var25 != local_e8);
      }
      return;
    }
    uVar31 = uVar31 * 2;
  } while( true );
}

Assistant:

auto Proof::create_connected_constraints(int p, int t, const function<auto(int, int)->bool> & adj) -> void
{
    _imp->model_stream << "* selected vertices must be connected, walk 1\n";
    int mapped_to_null = t;
    int cnum = _imp->variable_mappings.size();

    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            string n = "conn1_" + to_string(v) + "_" + to_string(w);
            _imp->connected_variable_mappings.emplace(tuple{1, v, w}, n);
            if (! adj(v, w)) {
                // v not adjacent to w, so the walk does not exist
                _imp->model_stream << "1 ~x" << n << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }
            else {
                // v = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{v, mapped_to_null}] << " >= 1 ;\n";
                // w = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                // either v = null, or w = null, or the walk exists
                _imp->model_stream << "1 x" << n << " 1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                                   << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                _imp->nb_constraints += 3;
            }
        }

    int last_k = 0;
    for (int k = 2 ; ; k *= 2) {
        last_k = k;
        _imp->model_stream << "* selected vertices must be connected, walk " << k << '\n';
        for (int v = 0; v < p; ++v)
            for (int w = 0; w < v; ++w) {
                string n = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w);
                _imp->connected_variable_mappings.emplace(tuple{k, v, w}, n);

                vector<string> ors;
                for (int u = 0; u < p; ++u) {
                    if (v != w && v != u && u != w) {
                        string m = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w) + "_via_" + to_string(u);
                        ors.push_back(m);
                        _imp->connected_variable_mappings_aux.emplace(tuple{k, v, w, u}, m);
                        // either the first half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, v), min(u, v)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // either the second half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // one of the half walks is false, or the via term must be true
                        _imp->model_stream << "1 x" << m
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(v, u), min(v, u)}]
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}] << " >= 1 ;\n";
                        _imp->nb_constraints += 3;
                    }
                }

                // one of the vias must be true, or a shorter walk exists, or the entry is false
                _imp->model_stream << "1 ~x" << n;
                for (auto & o : ors)
                    _imp->model_stream << " 1 x" << o;
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}];
                _imp->model_stream << " >= 1 ;\n";
                ++_imp->nb_constraints;

                // if the entry is false, then all of the vias must be false and the shorter walk must be false
                for (auto & o : ors) {
                    _imp->model_stream << "1 x" << n << " 1 ~x" << o << " >= 1 ;\n";
                    ++_imp->nb_constraints;
                }
                _imp->model_stream << "1 x" << n << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}] << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }

        if (k >= min(p, t))
            break;
    }

    _imp->model_stream << "* if two vertices are used, they must be connected\n";
    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            _imp->model_stream << "1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                               << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}];
            auto var = _imp->connected_variable_mappings.find(tuple{last_k, v, w});
            if (var != _imp->connected_variable_mappings.end())
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{last_k, v, w}];
            _imp->model_stream << " >= 1 ;\n";
            ++_imp->nb_constraints;
        }
}